

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O1

bool __thiscall actorpp::detail::ChannelImpl<bool>::pop(ChannelImpl<bool> *this)

{
  bool bVar1;
  logic_error *this_00;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device =
       &((this->actor_impl).
         super___shared_ptr<actorpp::detail::ActorImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mut;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if ((this->elements).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      (this->elements).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    bVar1 = *(this->elements).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    std::deque<bool,_std::allocator<bool>_>::pop_front(&(this->elements).c);
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
    return bVar1;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"called pop() on unreadable channel");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

T pop() {
    std::unique_lock<std::mutex> lock(actor_impl->mut);
    if (!readable_with_lock())
      throw std::logic_error("called pop() on unreadable channel");
    T element = std::move(elements.front());
    elements.pop();
    return element;
  }